

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylehelper.cpp
# Opt level: O1

int QStyleHelper::calcBigLineSize(int radius)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 4;
  if (4 < radius / 6) {
    iVar2 = radius / 6;
  }
  iVar1 = radius / 2;
  if (iVar2 < radius / 2) {
    iVar1 = iVar2;
  }
  return iVar1;
}

Assistant:

int calcBigLineSize(int radius)
{
    int bigLineSize = radius / 6;
    if (bigLineSize < 4)
        bigLineSize = 4;
    if (bigLineSize > radius / 2)
        bigLineSize = radius / 2;
    return bigLineSize;
}